

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void pack_filters(int16_t *filter,__m256i *f)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [16];
  undefined1 auVar19 [16];
  __m256i p3;
  __m256i p2;
  __m256i p1;
  __m256i p0;
  __m256i hh;
  __m128i h;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  
  uVar7 = *(undefined8 *)*in_RDI;
  uVar8 = *(undefined8 *)(*in_RDI + 8);
  auVar18 = *in_RDI;
  auVar17 = *in_RDI;
  auVar16 = *in_RDI;
  auVar1 = vpinsrd_avx(ZEXT416(0x3020100),0x3020100,1);
  auVar1 = vpinsrd_avx(auVar1,0x3020100,2);
  auVar1 = vpinsrd_avx(auVar1,0x3020100,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x3020100),0x3020100,1);
  auVar2 = vpinsrd_avx(auVar2,0x3020100,2);
  auVar2 = vpinsrd_avx(auVar2,0x3020100,3);
  uStack_230 = auVar2._0_8_;
  uStack_228 = auVar2._8_8_;
  auVar2 = vpinsrd_avx(ZEXT416(0x7060504),0x7060504,1);
  auVar2 = vpinsrd_avx(auVar2,0x7060504,2);
  auVar2 = vpinsrd_avx(auVar2,0x7060504,3);
  auVar3 = vpinsrd_avx(ZEXT416(0x7060504),0x7060504,1);
  auVar3 = vpinsrd_avx(auVar3,0x7060504,2);
  auVar3 = vpinsrd_avx(auVar3,0x7060504,3);
  uStack_1f0 = auVar3._0_8_;
  uStack_1e8 = auVar3._8_8_;
  auVar3 = vpinsrd_avx(ZEXT416(0xb0a0908),0xb0a0908,1);
  auVar3 = vpinsrd_avx(auVar3,0xb0a0908,2);
  auVar3 = vpinsrd_avx(auVar3,0xb0a0908,3);
  auVar4 = vpinsrd_avx(ZEXT416(0xb0a0908),0xb0a0908,1);
  auVar4 = vpinsrd_avx(auVar4,0xb0a0908,2);
  auVar4 = vpinsrd_avx(auVar4,0xb0a0908,3);
  uStack_1b0 = auVar4._0_8_;
  uStack_1a8 = auVar4._8_8_;
  auVar4 = vpinsrd_avx(ZEXT416(0xf0e0d0c),0xf0e0d0c,1);
  auVar4 = vpinsrd_avx(auVar4,0xf0e0d0c,2);
  auVar4 = vpinsrd_avx(auVar4,0xf0e0d0c,3);
  auVar5 = vpinsrd_avx(ZEXT416(0xf0e0d0c),0xf0e0d0c,1);
  auVar5 = vpinsrd_avx(auVar5,0xf0e0d0c,2);
  auVar5 = vpinsrd_avx(auVar5,0xf0e0d0c,3);
  auVar19 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  uStack_170 = auVar19._0_8_;
  uStack_168 = auVar19._8_8_;
  auVar15._16_8_ = uVar7;
  auVar15._0_16_ = *in_RDI;
  auVar15._24_8_ = uVar8;
  auVar14._16_8_ = uStack_230;
  auVar14._0_16_ = auVar1;
  auVar14._24_8_ = uStack_228;
  auVar6 = vpshufb_avx2(auVar15,auVar14);
  *in_RSI = auVar6;
  auVar13._16_8_ = uVar7;
  auVar13._0_16_ = auVar16;
  auVar13._24_8_ = uVar8;
  auVar12._16_8_ = uStack_1f0;
  auVar12._0_16_ = auVar2;
  auVar12._24_8_ = uStack_1e8;
  auVar6 = vpshufb_avx2(auVar13,auVar12);
  in_RSI[1] = auVar6;
  auVar11._16_8_ = uVar7;
  auVar11._0_16_ = auVar17;
  auVar11._24_8_ = uVar8;
  auVar10._16_8_ = uStack_1b0;
  auVar10._0_16_ = auVar3;
  auVar10._24_8_ = uStack_1a8;
  auVar6 = vpshufb_avx2(auVar11,auVar10);
  in_RSI[2] = auVar6;
  auVar9._16_8_ = uVar7;
  auVar9._0_16_ = auVar18;
  auVar9._24_8_ = uVar8;
  auVar6._16_8_ = uStack_170;
  auVar6._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
  auVar6._24_8_ = uStack_168;
  auVar6 = vpshufb_avx2(auVar9,auVar6);
  in_RSI[3] = auVar6;
  return;
}

Assistant:

static inline void pack_filters(const int16_t *filter, __m256i *f /*f[4]*/) {
  const __m128i h = _mm_loadu_si128((const __m128i *)filter);
  const __m256i hh = _mm256_insertf128_si256(_mm256_castsi128_si256(h), h, 1);
  const __m256i p0 = _mm256_set1_epi32(0x03020100);
  const __m256i p1 = _mm256_set1_epi32(0x07060504);
  const __m256i p2 = _mm256_set1_epi32(0x0b0a0908);
  const __m256i p3 = _mm256_set1_epi32(0x0f0e0d0c);
  f[0] = _mm256_shuffle_epi8(hh, p0);
  f[1] = _mm256_shuffle_epi8(hh, p1);
  f[2] = _mm256_shuffle_epi8(hh, p2);
  f[3] = _mm256_shuffle_epi8(hh, p3);
}